

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O2

RC __thiscall QL_Node::CheckConditions(QL_Node *this,char *recData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  Cond *pCVar6;
  char cVar7;
  char *__dest;
  void *__dest_00;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  int i;
  long lVar11;
  
  lVar9 = 0x2c;
  lVar11 = 0;
  do {
    if (this->condIndex <= lVar11) {
      return 0;
    }
    pCVar6 = this->condList;
    iVar1 = *(int *)((long)pCVar6 + lVar9 + -0x2c);
    iVar2 = *(int *)((long)&pCVar6->offset1 + lVar9);
    iVar3 = *(int *)((long)pCVar6 + lVar9 + -8);
    if (*(char *)((long)pCVar6 + lVar9 + -0x1c) == '\0') {
      if (iVar2 != 2) {
LAB_0010ffcf:
        pcVar8 = recData + *(int *)((long)pCVar6 + lVar9 + -0xc);
        goto LAB_0010ffda;
      }
      iVar2 = *(int *)((long)pCVar6 + lVar9 + -4);
      if (iVar3 == iVar2) goto LAB_0010ffcf;
      iVar5 = *(int *)((long)pCVar6 + lVar9 + -0xc);
      if (iVar2 <= iVar3) {
        __dest = (char *)calloc(1,(long)iVar2 + 1);
        memcpy(__dest,recData + iVar5,(long)*(int *)((long)pCVar6 + lVar9 + -4));
        __dest[*(int *)((long)pCVar6 + lVar9 + -4)] = '\0';
        cVar7 = (**(code **)((long)pCVar6 + lVar9 + -0x24))
                          (recData + iVar1,__dest,*(undefined4 *)((long)&pCVar6->offset1 + lVar9),
                           *(int *)((long)pCVar6 + lVar9 + -4) + 1);
        goto LAB_00110165;
      }
      __dest_00 = calloc(1,(long)iVar3 + 1);
      memcpy(__dest_00,recData + iVar1,(long)*(int *)((long)pCVar6 + lVar9 + -8));
      *(undefined1 *)((long)__dest_00 + (long)*(int *)((long)pCVar6 + lVar9 + -8)) = 0;
      cVar7 = (**(code **)((long)pCVar6 + lVar9 + -0x24))
                        (__dest_00,recData + iVar5,*(undefined4 *)((long)&pCVar6->offset1 + lVar9),
                         *(int *)((long)pCVar6 + lVar9 + -8) + 1);
      free(__dest_00);
    }
    else {
      if (iVar2 == 2) {
        iVar2 = *(int *)((long)pCVar6 + lVar9 + -4);
        if (iVar3 != iVar2) {
          if (iVar3 < iVar2) {
            __dest = (char *)calloc(1,(long)iVar3 + 1);
            memcpy(__dest,recData + iVar1,(long)*(int *)((long)pCVar6 + lVar9 + -8));
            __dest[*(int *)((long)pCVar6 + lVar9 + -8)] = '\0';
            uVar4 = *(undefined4 *)((long)&pCVar6->offset1 + lVar9);
            iVar1 = *(int *)((long)pCVar6 + lVar9 + -8);
            pcVar8 = *(char **)((long)pCVar6 + lVar9 + -0x14);
            pcVar10 = __dest;
          }
          else {
            __dest = (char *)calloc(1,(long)iVar2 + 1);
            memcpy(__dest,*(void **)((long)pCVar6 + lVar9 + -0x14),
                   (long)*(int *)((long)pCVar6 + lVar9 + -4));
            __dest[*(int *)((long)pCVar6 + lVar9 + -4)] = '\0';
            pcVar10 = recData + iVar1;
            iVar1 = *(int *)((long)pCVar6 + lVar9 + -4);
            uVar4 = *(undefined4 *)((long)&pCVar6->offset1 + lVar9);
            pcVar8 = __dest;
          }
          cVar7 = (**(code **)((long)pCVar6 + lVar9 + -0x24))(pcVar10,pcVar8,uVar4,iVar1 + 1);
LAB_00110165:
          free(__dest);
          goto joined_r0x0011016c;
        }
      }
      pcVar8 = *(char **)((long)pCVar6 + lVar9 + -0x14);
LAB_0010ffda:
      cVar7 = (**(code **)((long)pCVar6 + lVar9 + -0x24))(recData + iVar1,pcVar8);
    }
joined_r0x0011016c:
    if (cVar7 == '\0') {
      return 0x197;
    }
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 0x30;
  } while( true );
}

Assistant:

RC QL_Node::CheckConditions(char *recData){
  RC rc = 0;
  for(int i = 0; i < condIndex; i++){
    int offset1 = condList[i].offset1;
    // If we are comparing this to a value
    if(! condList[i].isValue){
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        int offset2 = condList[i].offset2;
        bool comp = condList[i].comparator((void *)(recData + offset1), (void *)(recData + offset2), 
          condList[i].type, condList[i].length);

        if(comp == false){
          return (QL_CONDNOTMET);
        }
      }
      // Depending on if the value or attribute is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, (void*)(recData + offset2), condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, recData + offset2, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
    // Else, we are comparing it to another attribute
    else{
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        bool comp = condList[i].comparator((void *)(recData + offset1), condList[i].data, 
          condList[i].type, condList[i].length);

        if(comp == false)
          return (QL_CONDNOTMET);
      }
      // Depending on which one is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, condList[i].data, condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, condList[i].data, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
  }

  return (0);
}